

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

HashElem * findElementWithHash(Hash *pH,char *pKey,uint *pHash)

{
  HashElem *pHVar1;
  ulong uVar2;
  uint uVar3;
  int iVar4;
  byte *pbVar5;
  uint uVar6;
  Hash *pHVar7;
  byte bVar8;
  HashElem *pHVar9;
  
  if (pH->ht == (_ht *)0x0) {
    pHVar7 = (Hash *)&pH->count;
    uVar3 = 0;
  }
  else {
    bVar8 = *pKey;
    if (bVar8 == 0) {
      uVar3 = 0;
    }
    else {
      pbVar5 = (byte *)(pKey + 1);
      uVar3 = 0;
      do {
        uVar3 = (""[bVar8] + uVar3) * -0x61c8864f;
        bVar8 = *pbVar5;
        pbVar5 = pbVar5 + 1;
      } while (bVar8 != 0);
    }
    uVar2 = (ulong)uVar3 % (ulong)pH->htsize;
    uVar3 = (uint)uVar2;
    pHVar7 = (Hash *)(pH->ht + uVar2);
    pH = pHVar7;
  }
  uVar6 = pHVar7->htsize;
  pHVar1 = pH->first;
  if (pHash != (uint *)0x0) {
    *pHash = uVar3;
  }
  while ((pHVar9 = &findElementWithHash::nullElement, uVar6 != 0 &&
         (iVar4 = sqlite3StrICmp(pHVar1->pKey,pKey), pHVar9 = pHVar1, iVar4 != 0))) {
    pHVar1 = pHVar1->next;
    uVar6 = uVar6 - 1;
  }
  return pHVar9;
}

Assistant:

static HashElem *findElementWithHash(
  const Hash *pH,     /* The pH to be searched */
  const char *pKey,   /* The key we are searching for */
  unsigned int *pHash /* Write the hash value here */
){
  HashElem *elem;                /* Used to loop thru the element list */
  unsigned int count;            /* Number of elements left to test */
  unsigned int h;                /* The computed hash */
  static HashElem nullElement = { 0, 0, 0, 0 };

  if( pH->ht ){   /*OPTIMIZATION-IF-TRUE*/
    struct _ht *pEntry;
    h = strHash(pKey) % pH->htsize;
    pEntry = &pH->ht[h];
    elem = pEntry->chain;
    count = pEntry->count;
  }else{
    h = 0;
    elem = pH->first;
    count = pH->count;
  }
  if( pHash ) *pHash = h;
  while( count-- ){
    assert( elem!=0 );
    if( sqlite3StrICmp(elem->pKey,pKey)==0 ){ 
      return elem;
    }
    elem = elem->next;
  }
  return &nullElement;
}